

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O0

void splitRegion(MPI_Comm Region,int rank,int *dims,lattice *grid)

{
  int iVar1;
  long in_RCX;
  int *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int jt;
  int ir;
  int coords [2];
  int local_28;
  int local_24;
  long local_20;
  int *local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  if ((in_RDX != (int *)0x0) && (in_RCX != 0)) {
    *(undefined1 *)(in_RCX + 0x28) = 0;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    memset(&local_28,0,8);
    MPI_Cart_coords(local_8,local_c,2,&local_28);
    *(int *)(local_20 + 0x18) = (local_28 * *(int *)(local_20 + 0x10)) / *local_18;
    if (*(int *)(local_20 + 0x18) == 0) {
      *(byte *)(local_20 + 0x28) = *(byte *)(local_20 + 0x28) | 4;
    }
    iVar1 = ((local_28 + 1) * *(int *)(local_20 + 0x10)) / *local_18;
    if (iVar1 == *(int *)(local_20 + 0x10)) {
      *(byte *)(local_20 + 0x28) = *(byte *)(local_20 + 0x28) | 8;
    }
    *(int *)(local_20 + 0x20) = iVar1 - *(int *)(local_20 + 0x18);
    *(int *)(local_20 + 0x1c) = (local_24 * *(int *)(local_20 + 0x14)) / local_18[1];
    if (*(int *)(local_20 + 0x1c) == 0) {
      *(byte *)(local_20 + 0x28) = *(byte *)(local_20 + 0x28) | 2;
    }
    iVar1 = ((local_24 + 1) * *(int *)(local_20 + 0x14)) / local_18[1];
    if (iVar1 == *(int *)(local_20 + 0x14)) {
      *(byte *)(local_20 + 0x28) = *(byte *)(local_20 + 0x28) | 1;
    }
    *(int *)(local_20 + 0x24) = iVar1 - *(int *)(local_20 + 0x1c);
  }
  return;
}

Assistant:

void splitRegion (MPI_Comm Region, int rank, int *dims, lattice *grid)
{
	if (!dims || !grid)
		return;
	grid->edges = 0;
	int coords[2] = {0,0};
	MPI_Cart_coords(Region,rank,2,coords);

	/* Left and right */
	grid->il = coords[0]*grid->imax/dims[0];
	if (grid->il == 0)
		grid->edges |= LEFT;
	int ir = (coords[0]+1)*grid->imax/dims[0];
	if (ir == grid->imax)
		grid->edges |= RIGHT;
	grid->deli = ir - grid->il;

	/* Top and bottom: */
	grid->jb = coords[1]*grid->jmax/dims[1];
	if (grid->jb == 0)
		grid->edges |= BOTTOM;
	int jt = (coords[1]+1)*grid->jmax/dims[1];
	if (jt == grid->jmax)
		grid->edges |= TOP;
	grid->delj = jt - grid->jb;
	return;
}